

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

void __thiscall glslang::HlslGrammar::acceptAttributes(HlslGrammar *this,TAttributes *attributes)

{
  HlslParseContext *pHVar1;
  bool bVar2;
  int iVar3;
  TIntermAggregate *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  size_t s;
  undefined1 local_b0 [8];
  TAttributeArgs attributeArgs;
  TIntermTyped *pTStack_98;
  TAttributeType attributeType;
  byte local_89;
  TIntermTyped *pTStack_88;
  bool expectingExpression;
  TIntermTyped *node;
  TIntermAggregate *expressions;
  undefined1 local_70 [8];
  TString nameSpace;
  undefined1 local_40 [7];
  bool doubleBrackets;
  HlslToken attributeToken;
  TAttributes *attributes_local;
  HlslGrammar *this_local;
  
  attributeToken.field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)attributes;
  do {
    HlslToken::HlslToken((HlslToken *)local_40);
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
    if (!bVar2) {
      return;
    }
    nameSpace.field_2._M_local_buf[0xf] = '\0';
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
    if (bVar2) {
      nameSpace.field_2._M_local_buf[0xf] = '\x01';
    }
    bVar2 = acceptIdentifier(this,(HlslToken *)local_40);
    if ((!bVar2) &&
       (bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
       !bVar2)) {
      expected(this,"namespace or attribute identifier");
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_70);
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_70,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)attributeToken._24_8_);
      bVar2 = acceptIdentifier(this,(HlslToken *)local_40);
      if (bVar2) goto LAB_00671d5c;
      expected(this,"attribute identifier");
      expressions._4_4_ = 1;
    }
    else {
LAB_00671d5c:
      node = (TIntermTyped *)0x0;
      s = 0x163;
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      if (bVar2) {
        this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,s);
        TIntermAggregate::TIntermAggregate(this_00);
        local_89 = 0;
        node = (TIntermTyped *)this_00;
        while (bVar2 = acceptAssignmentExpression(this,&stack0xffffffffffffff78), bVar2) {
          local_89 = 0;
          iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x32])();
          pTStack_98 = pTStack_88;
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     CONCAT44(extraout_var,iVar3),(value_type *)&stack0xffffffffffffff68);
          bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
          if (bVar2) {
            local_89 = 1;
          }
        }
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
        if (!bVar2) {
          expected(this,")");
        }
        if ((local_89 & 1) == 0) {
          iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x32])();
          bVar2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::empty
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_00,iVar3));
          if (!bVar2) goto LAB_00671e6e;
        }
        expected(this,"expression");
      }
LAB_00671e6e:
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket);
      if (bVar2) {
        if (((nameSpace.field_2._M_local_buf[0xf] & 1U) == 0) ||
           (bVar2 = HlslTokenStream::acceptTokenClass
                              (&this->super_HlslTokenStream,EHTokRightBracket), bVar2)) {
          if (attributeToken._24_8_ != 0) {
            attributeArgs.args._4_4_ =
                 HlslParseContext::attributeFromName
                           (this->parseContext,(TString *)local_70,(TString *)attributeToken._24_8_)
            ;
            if (attributeArgs.args._4_4_ == EatNone) {
              pHVar1 = this->parseContext;
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)attributeToken._24_8_);
              (*(pHVar1->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (pHVar1,local_40,"unrecognized attribute",pcVar4,"");
            }
            else {
              attributeArgs._0_8_ = node;
              local_b0._0_4_ = attributeArgs.args._4_4_;
              std::__cxx11::
              list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::
              push_back((list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         *)attributeToken.field_2.string,(value_type *)local_b0);
            }
          }
          expressions._4_4_ = 0;
        }
        else {
          expected(this,"]]");
          expressions._4_4_ = 1;
        }
      }
      else {
        expected(this,"]");
        expressions._4_4_ = 1;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_70);
    if (expressions._4_4_ != 0) {
      return;
    }
  } while( true );
}

Assistant:

void HlslGrammar::acceptAttributes(TAttributes& attributes)
{
    // For now, accept the [ XXX(X) ] syntax, but drop all but
    // numthreads, which is used to set the CS local size.
    // TODO: subset to correct set?  Pass on?
    do {
        HlslToken attributeToken;

        // LEFT_BRACKET?
        if (! acceptTokenClass(EHTokLeftBracket))
            return;
        // another LEFT_BRACKET?
        bool doubleBrackets = false;
        if (acceptTokenClass(EHTokLeftBracket))
            doubleBrackets = true;

        // attribute? (could be namespace; will adjust later)
        if (!acceptIdentifier(attributeToken)) {
            if (!peekTokenClass(EHTokRightBracket)) {
                expected("namespace or attribute identifier");
                advanceToken();
            }
        }

        TString nameSpace;
        if (acceptTokenClass(EHTokColonColon)) {
            // namespace COLON COLON
            nameSpace = *attributeToken.string;
            // attribute
            if (!acceptIdentifier(attributeToken)) {
                expected("attribute identifier");
                return;
            }
        }

        TIntermAggregate* expressions = nullptr;

        // (x, ...)
        if (acceptTokenClass(EHTokLeftParen)) {
            expressions = new TIntermAggregate;

            TIntermTyped* node;
            bool expectingExpression = false;

            while (acceptAssignmentExpression(node)) {
                expectingExpression = false;
                expressions->getSequence().push_back(node);
                if (acceptTokenClass(EHTokComma))
                    expectingExpression = true;
            }

            // 'expressions' is an aggregate with the expressions in it
            if (! acceptTokenClass(EHTokRightParen))
                expected(")");

            // Error for partial or missing expression
            if (expectingExpression || expressions->getSequence().empty())
                expected("expression");
        }

        // RIGHT_BRACKET
        if (!acceptTokenClass(EHTokRightBracket)) {
            expected("]");
            return;
        }
        // another RIGHT_BRACKET?
        if (doubleBrackets && !acceptTokenClass(EHTokRightBracket)) {
            expected("]]");
            return;
        }

        // Add any values we found into the attribute map.
        if (attributeToken.string != nullptr) {
            TAttributeType attributeType = parseContext.attributeFromName(nameSpace, *attributeToken.string);
            if (attributeType == EatNone)
                parseContext.warn(attributeToken.loc, "unrecognized attribute", attributeToken.string->c_str(), "");
            else {
                TAttributeArgs attributeArgs = { attributeType, expressions };
                attributes.push_back(attributeArgs);
            }
        }
    } while (true);
}